

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O2

Status __thiscall
leveldb::Table::Open
          (Table *this,Options *options,RandomAccessFile *file,uint64_t size,Table **table)

{
  long lVar1;
  int iVar2;
  Block *this_00;
  Rep *this_01;
  undefined4 extraout_var;
  Table *this_02;
  long lVar4;
  Options *pOVar5;
  Rep *pRVar6;
  long in_FS_OFFSET;
  byte bVar7;
  Table local_d0;
  ReadOptions opt;
  Footer footer;
  Slice footer_input;
  BlockContents index_block_contents;
  char footer_space [48];
  uint64_t uVar3;
  
  bVar7 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *table = (Table *)0x0;
  if (size < 0x30) {
    footer_space._0_8_ = anon_var_dwarf_398a566;
    footer_space[8] = '\"';
    footer_space[9] = '\0';
    footer_space[10] = '\0';
    footer_space[0xb] = '\0';
    footer_space[0xc] = '\0';
    footer_space[0xd] = '\0';
    footer_space[0xe] = '\0';
    footer_space[0xf] = '\0';
    footer.metaindex_handle_.offset_ = (long)"\x05\x04\x03\x02\x01" + 5;
    footer.metaindex_handle_.size_ = 0;
    Status::Corruption((Status *)this,(Slice *)footer_space,(Slice *)&footer);
  }
  else {
    footer_input.data_ = "";
    footer_input.size_ = 0;
    (*file->_vptr_RandomAccessFile[2])(this,file,size - 0x30,0x30,&footer_input,footer_space);
    if (this->rep_ == (Rep *)0x0) {
      footer.index_handle_.offset_._0_4_ = 0xffffffff;
      footer.index_handle_.offset_._4_4_ = 0xffffffff;
      footer.index_handle_.size_._0_4_ = 0xffffffff;
      footer.index_handle_.size_._4_4_ = 0xffffffff;
      footer.metaindex_handle_.offset_ = 0xffffffffffffffff;
      footer.metaindex_handle_.size_ = 0xffffffffffffffff;
      Footer::DecodeFrom((Footer *)&index_block_contents,(Slice *)&footer);
      pRVar6 = this->rep_;
      this->rep_ = (Rep *)index_block_contents.data.data_;
      index_block_contents.data.data_ = (char *)pRVar6;
      Status::~Status((Status *)&index_block_contents);
      if (this->rep_ == (Rep *)0x0) {
        index_block_contents.data.data_ = "";
        index_block_contents.data.size_ = 0;
        opt.verify_checksums = false;
        opt.fill_cache = true;
        opt.snapshot = (Snapshot *)0x0;
        if (options->paranoid_checks == true) {
          opt.verify_checksums = true;
          opt.fill_cache = true;
        }
        ReadBlock((leveldb *)&local_d0,file,&opt,&footer.index_handle_,&index_block_contents);
        pRVar6 = this->rep_;
        this->rep_ = (Rep *)local_d0;
        local_d0.rep_ = pRVar6;
        Status::~Status((Status *)&local_d0);
        if (this->rep_ == (Rep *)0x0) {
          this_00 = (Block *)operator_new(0x18);
          Block::Block(this_00,&index_block_contents);
          this_01 = (Rep *)operator_new(0xa0);
          Rep::Rep(this_01);
          pOVar5 = options;
          pRVar6 = this_01;
          for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
            (pRVar6->options).comparator = pOVar5->comparator;
            pOVar5 = (Options *)((long)pOVar5 + (ulong)bVar7 * -0x10 + 8);
            pRVar6 = (Rep *)((long)pRVar6 + (ulong)bVar7 * -0x10 + 8);
          }
          this_01->file = file;
          (this_01->metaindex_handle).offset_ = footer.metaindex_handle_.offset_;
          (this_01->metaindex_handle).size_ = footer.metaindex_handle_.size_;
          this_01->index_block = this_00;
          if (options->block_cache == (Cache *)0x0) {
            uVar3 = 0;
          }
          else {
            iVar2 = (*options->block_cache->_vptr_Cache[7])();
            uVar3 = CONCAT44(extraout_var,iVar2);
          }
          this_01->cache_id = uVar3;
          this_01->filter = (FilterBlockReader *)0x0;
          this_01->filter_data = (char *)0x0;
          this_02 = (Table *)operator_new(8);
          this_02->rep_ = this_01;
          *table = this_02;
          ReadMeta(this_02,&footer);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status Table::Open(const Options& options, RandomAccessFile* file,
                   uint64_t size, Table** table) {
  *table = nullptr;
  if (size < Footer::kEncodedLength) {
    return Status::Corruption("file is too short to be an sstable");
  }

  char footer_space[Footer::kEncodedLength];
  Slice footer_input;
  Status s = file->Read(size - Footer::kEncodedLength, Footer::kEncodedLength,
                        &footer_input, footer_space);
  if (!s.ok()) return s;

  Footer footer;
  s = footer.DecodeFrom(&footer_input);
  if (!s.ok()) return s;

  // Read the index block
  BlockContents index_block_contents;
  if (s.ok()) {
    ReadOptions opt;
    if (options.paranoid_checks) {
      opt.verify_checksums = true;
    }
    s = ReadBlock(file, opt, footer.index_handle(), &index_block_contents);
  }

  if (s.ok()) {
    // We've successfully read the footer and the index block: we're
    // ready to serve requests.
    Block* index_block = new Block(index_block_contents);
    Rep* rep = new Table::Rep;
    rep->options = options;
    rep->file = file;
    rep->metaindex_handle = footer.metaindex_handle();
    rep->index_block = index_block;
    rep->cache_id = (options.block_cache ? options.block_cache->NewId() : 0);
    rep->filter_data = nullptr;
    rep->filter = nullptr;
    *table = new Table(rep);
    (*table)->ReadMeta(footer);
  }

  return s;
}